

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
          (QGraphicsProxyWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  QPointer<QWidget> *this_00;
  QPointer<QWidget> *pQVar1;
  QObject *pQVar2;
  Data *pDVar3;
  QGraphicsItem *pQVar4;
  char cVar5;
  bool bVar6;
  MouseButton MVar7;
  MouseButtons MVar8;
  KeyboardModifiers KVar9;
  MouseEventSource MVar10;
  QFlagsStorage<Qt::MouseButton> QVar11;
  QGraphicsItem *pQVar12;
  QPoint QVar13;
  QWidget *pQVar14;
  undefined8 uVar15;
  Data *pDVar16;
  QWeakPointer<QObject> *pQVar17;
  QWidget *nativeWidget;
  QWidget *pQVar18;
  QWeakPointer<QObject> *pQVar19;
  QGraphicsItem *pQVar20;
  long in_FS_OFFSET;
  bool bVar21;
  double dVar22;
  undefined4 local_124;
  QCursor widgetsCursor;
  QPoint local_e8;
  QWidget *embeddedMouseGrabberPtr;
  double local_d8;
  QPoint local_d0;
  QGraphicsItem local_c8;
  QMouseEvent mouseEvent;
  QWeakPointer<QObject> local_68;
  QWeakPointer<QObject> local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((event == (QGraphicsSceneMouseEvent *)0x0) ||
       (pDVar16 = (this->widget).wp.d, pDVar16 == (Data *)0x0)) ||
      (pQVar2 = (this->widget).wp.value, pQVar2 == (QObject *)0x0 || *(int *)(pDVar16 + 4) == 0)) ||
     ((*(byte *)(*(long *)(pQVar2 + 0x20) + 9) & 0x80) == 0)) goto LAB_005f855a;
  pQVar12 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pQVar20 = pQVar12 + -1;
  if (pQVar12 == (QGraphicsItem *)0x0) {
    pQVar20 = (QGraphicsItem *)0x0;
  }
  local_48 = QGraphicsSceneMouseEvent::pos(event);
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  dVar22 = (double)((ulong)local_48.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.xp;
  bVar6 = 2147483647.0 < dVar22;
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  _mouseEvent = (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar22);
  dVar22 = (double)((ulong)local_48.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.yp;
  bVar6 = 2147483647.0 < dVar22;
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  register0x00000004 =
       (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar22);
  local_68.value =
       &QWidget::childAt((QWidget *)(this->widget).wp.value,(QPoint *)&mouseEvent)->super_QObject;
  if ((QWidget *)local_68.value == (QWidget *)0x0) {
    local_58.d = (Data *)0x0;
    local_58.value = (QObject *)0x0;
LAB_005f7c5d:
    local_68.d = (this->widget).wp.d;
    local_68.value = (this->widget).wp.value;
    if (local_68.d != (Data *)0x0) goto LAB_005f7c80;
LAB_005f7ca1:
    pQVar18 = (QWidget *)0x0;
  }
  else {
    local_68.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(local_68.value);
    local_58.d = local_68.d;
    local_58.value = local_68.value;
    if ((local_68.d == (Data *)0x0) || (*(int *)(local_68.d + 4) == 0)) goto LAB_005f7c5d;
LAB_005f7c80:
    LOCK();
    *(int *)local_68.d = *(int *)local_68.d + 1;
    UNLOCK();
    if ((local_68.d == (Data *)0x0) ||
       (pQVar18 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) goto LAB_005f7ca1;
  }
  pQVar12 = (QGraphicsItem *)QWidgetPrivate::nearestGraphicsProxyWidget(pQVar18);
  if (pQVar12 != pQVar20) goto LAB_005f850e;
  switch(*(undefined2 *)&(event->super_QGraphicsSceneEvent).field_0x8) {
  case 0x9b:
    pDVar16 = (this->embeddedMouseGrabber).wp.d;
    local_124 = 5;
    if (pDVar16 != (Data *)0x0) {
      bVar6 = false;
      if ((*(int *)(pDVar16 + 4) == 0) || ((this->embeddedMouseGrabber).wp.value == (QObject *)0x0))
      goto LAB_005f7e20;
      QWeakPointer<QObject>::operator=(&local_68,&(this->embeddedMouseGrabber).wp);
    }
    break;
  case 0x9c:
    pQVar17 = &(this->embeddedMouseGrabber).wp;
    pDVar16 = (this->embeddedMouseGrabber).wp.d;
    if (((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) ||
       ((this->embeddedMouseGrabber).wp.value == (QObject *)0x0)) {
      pQVar19 = &local_68;
    }
    else {
      pQVar19 = pQVar17;
      pQVar17 = &local_68;
    }
    QWeakPointer<QObject>::operator=(pQVar17,pQVar19);
    local_124 = 2;
    break;
  case 0x9d:
    pDVar16 = (this->embeddedMouseGrabber).wp.d;
    local_124 = 3;
    bVar6 = true;
    if (((pDVar16 != (Data *)0x0) && (*(int *)(pDVar16 + 4) != 0)) &&
       ((this->embeddedMouseGrabber).wp.value != (QObject *)0x0)) {
      QWeakPointer<QObject>::operator=(&local_68,&(this->embeddedMouseGrabber).wp);
    }
    goto LAB_005f7e20;
  case 0x9e:
    pQVar17 = &(this->embeddedMouseGrabber).wp;
    pDVar16 = (this->embeddedMouseGrabber).wp.d;
    if (((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) ||
       ((this->embeddedMouseGrabber).wp.value == (QObject *)0x0)) {
      pQVar19 = &local_68;
    }
    else {
      pQVar19 = pQVar17;
      pQVar17 = &local_68;
    }
    QWeakPointer<QObject>::operator=(pQVar17,pQVar19);
    local_124 = 4;
    break;
  default:
    bVar6 = false;
    local_124 = 0;
    goto LAB_005f7e20;
  }
  bVar6 = false;
LAB_005f7e20:
  this_00 = &this->lastWidgetUnderMouse;
  pDVar16 = (this->lastWidgetUnderMouse).wp.d;
  if (((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) ||
     ((this->lastWidgetUnderMouse).wp.value == (QObject *)0x0)) {
    pDVar16 = (this->embeddedMouseGrabber).wp.d;
    pQVar17 = &local_68;
    if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
      bVar21 = false;
    }
    else {
      bVar21 = (this->embeddedMouseGrabber).wp.value != (QObject *)0x0;
      if (bVar21) {
        pQVar17 = &(this->embeddedMouseGrabber).wp;
      }
    }
    if ((pQVar17->d == (Data *)0x0) || (*(int *)(pQVar17->d + 4) == 0)) {
      pQVar18 = (QWidget *)0x0;
    }
    else {
      pQVar17 = &local_68;
      if (bVar21) {
        pQVar17 = &(this->embeddedMouseGrabber).wp;
      }
      pQVar18 = (QWidget *)pQVar17->value;
    }
    QVar13 = QGraphicsSceneMouseEvent::screenPos(event);
    _mouseEvent = (QPoint)(double)QVar13.xp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave(pQVar18,(QWidget *)0x0,(QPointF *)&mouseEvent);
    QWeakPointer<QObject>::operator=(&this_00->wp,&local_68);
  }
  if ((local_68.d == (Data *)0x0) ||
     (pQVar18 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar18 = (QWidget *)0x0;
  }
  local_48 = mapToReceiver(this,&local_48,pQVar18);
  _mouseEvent = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar18 = (QWidget *)0x0;
  if (*(int *)(local_68.d + 4) != 0) {
    pQVar18 = (QWidget *)local_68.value;
  }
  pQVar14 = QWidget::window((QWidget *)local_68.value);
  dVar22 = (double)((ulong)local_48.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.xp;
  bVar21 = 2147483647.0 < dVar22;
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  local_d0.xp.m_i =
       (int)(double)(-(ulong)bVar21 & 0x41dfffffffc00000 | ~-(ulong)bVar21 & (ulong)dVar22);
  dVar22 = (double)((ulong)local_48.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.yp;
  bVar21 = 2147483647.0 < dVar22;
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  local_d0.yp.m_i =
       (int)(double)(-(ulong)bVar21 & 0x41dfffffffc00000 | ~-(ulong)bVar21 & (ulong)dVar22);
  QVar13 = QWidget::mapTo(pQVar18,pQVar14,&local_d0);
  local_c8.d_ptr.d = (QGraphicsItemPrivate *)(double)QVar13.yp.m_i.m_i;
  local_c8._vptr_QGraphicsItem = (_func_int **)(double)QVar13.xp.m_i.m_i;
  dVar22 = (double)((ulong)local_48.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.xp;
  bVar21 = 2147483647.0 < dVar22;
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  local_e8.xp.m_i =
       (int)(double)(-(ulong)bVar21 & 0x41dfffffffc00000 | ~-(ulong)bVar21 & (ulong)dVar22);
  dVar22 = (double)((ulong)local_48.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.yp;
  bVar21 = 2147483647.0 < dVar22;
  if (dVar22 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  local_e8.yp.m_i =
       (int)(double)(-(ulong)bVar21 & 0x41dfffffffc00000 | ~-(ulong)bVar21 & (ulong)dVar22);
  QVar13 = QWidget::mapToGlobal((QWidget *)local_68.value,&local_e8);
  embeddedMouseGrabberPtr = (QWidget *)(double)QVar13.xp.m_i.m_i;
  local_d8 = (double)QVar13.yp.m_i.m_i;
  MVar7 = QGraphicsSceneMouseEvent::button(event);
  MVar8 = QGraphicsSceneMouseEvent::buttons(event);
  KVar9 = QGraphicsSceneMouseEvent::modifiers(event);
  MVar10 = QGraphicsSceneMouseEvent::source(event);
  widgetsCursor.d = (QCursorData *)0x0;
  uVar15 = QPointingDevice::primaryPointingDevice((QString *)&widgetsCursor);
  QMouseEvent::QMouseEvent
            (&mouseEvent,local_124,&local_48,&local_c8,&embeddedMouseGrabberPtr,MVar7,
             MVar8.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
             super_QFlagsStorage<Qt::MouseButton>.i,
             KVar9.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i,MVar10,uVar15);
  if (widgetsCursor.d != (QCursorData *)0x0) {
    LOCK();
    *(int *)widgetsCursor.d = *(int *)widgetsCursor.d + -1;
    UNLOCK();
    if (*(int *)widgetsCursor.d == 0) {
      QArrayData::deallocate((QArrayData *)widgetsCursor.d,2,0x10);
    }
  }
  QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  QPointerEvent::setTimestamp((ulonglong)&mouseEvent);
  pDVar16 = (this->embeddedMouseGrabber).wp.d;
  if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
    embeddedMouseGrabberPtr = (QWidget *)0x0;
  }
  else {
    embeddedMouseGrabberPtr = (QWidget *)(this->embeddedMouseGrabber).wp.value;
  }
  if ((local_68.d == (Data *)0x0) ||
     (pQVar18 = (QWidget *)local_68.value, *(int *)(local_68.d + 4) == 0)) {
    pQVar18 = (QWidget *)0x0;
  }
  pQVar17 = &(this->widget).wp;
  if ((local_58.d == (Data *)0x0) ||
     (pQVar14 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
    pQVar14 = (QWidget *)0x0;
  }
  pDVar16 = (((QPointer<QWidget> *)pQVar17)->wp).d;
  if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
    nativeWidget = (QWidget *)0x0;
  }
  else {
    nativeWidget = (QWidget *)(this->widget).wp.value;
  }
  QApplicationPrivate::sendMouseEvent
            (pQVar18,&mouseEvent,pQVar14,nativeWidget,&embeddedMouseGrabberPtr,this_00,
             (bool)(event->super_QGraphicsSceneEvent).field_0xb,false);
  pQVar18 = embeddedMouseGrabberPtr;
  if (embeddedMouseGrabberPtr == (QWidget *)0x0) {
    pDVar16 = (Data *)0x0;
  }
  else {
    pDVar16 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef
                                (&embeddedMouseGrabberPtr->super_QObject);
  }
  pQVar1 = &this->embeddedMouseGrabber;
  pDVar3 = (this->embeddedMouseGrabber).wp.d;
  (this->embeddedMouseGrabber).wp.d = pDVar16;
  (this->embeddedMouseGrabber).wp.value = &pQVar18->super_QObject;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
    pDVar16 = (pQVar1->wp).d;
  }
  if ((((pDVar16 != (Data *)0x0) && (*(int *)(pDVar16 + 4) != 0)) &&
      (bVar6 && (this->embeddedMouseGrabber).wp.value != (QObject *)0x0)) &&
     (QVar11.i = (Int)QGraphicsSceneMouseEvent::buttons(event),
     (QFlagsStorage<Qt::MouseButton>)QVar11.i == (QFlagsStorage<Qt::MouseButton>)0x0)) {
    pQVar4 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
    pQVar12 = pQVar4 + -1;
    if (pQVar4 == (QGraphicsItem *)0x0) {
      pQVar12 = (QGraphicsItem *)0x0;
    }
    QGraphicsWidget::size((QGraphicsWidget *)pQVar12);
    widgetsCursor.d = (QCursorData *)0x0;
    local_c8 = (QGraphicsItem)QGraphicsSceneMouseEvent::pos(event);
    cVar5 = QRectF::contains((QPointF *)&widgetsCursor);
    if ((cVar5 == '\0') || (bVar6 = QGraphicsItem::acceptHoverEvents(pQVar12 + 1), !bVar6)) {
      pDVar16 = (this_00->wp).d;
      (this_00->wp).d = (Data *)0x0;
      (this->lastWidgetUnderMouse).wp.value = (QObject *)0x0;
      if (pDVar16 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar16 = *(int *)pDVar16 + -1;
        UNLOCK();
        if (*(int *)pDVar16 == 0) {
          operator_delete(pDVar16);
        }
        goto LAB_005f83a9;
      }
LAB_005f83c6:
      pQVar18 = (QWidget *)0x0;
    }
    else {
      if (((local_58.d != (Data *)0x0) && (*(int *)(local_58.d + 4) != 0)) &&
         ((QWidget *)local_58.value != (QWidget *)0x0)) {
        pQVar17 = &local_58;
      }
      QWeakPointer<QObject>::operator=(&this_00->wp,pQVar17);
LAB_005f83a9:
      pDVar16 = (this_00->wp).d;
      if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) goto LAB_005f83c6;
      pQVar18 = (QWidget *)(this->lastWidgetUnderMouse).wp.value;
    }
    pDVar16 = (pQVar1->wp).d;
    if ((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    else {
      pQVar14 = (QWidget *)(this->embeddedMouseGrabber).wp.value;
    }
    QVar13 = QGraphicsSceneMouseEvent::screenPos(event);
    widgetsCursor.d = (QCursorData *)(double)QVar13.xp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave(pQVar18,pQVar14,(QPointF *)&widgetsCursor);
    pDVar16 = (pQVar1->wp).d;
    (pQVar1->wp).d = (Data *)0x0;
    (this->embeddedMouseGrabber).wp.value = (QObject *)0x0;
    if (pDVar16 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar16 = *(int *)pDVar16 + -1;
      UNLOCK();
      if (*(int *)pDVar16 == 0) {
        operator_delete(pDVar16);
      }
    }
    pDVar16 = (this_00->wp).d;
    if (((pDVar16 == (Data *)0x0) || (*(int *)(pDVar16 + 4) == 0)) ||
       ((this->lastWidgetUnderMouse).wp.value == (QObject *)0x0)) {
      QGraphicsItem::unsetCursor(pQVar12 + 1);
    }
  }
  pDVar16 = (this_00->wp).d;
  if ((pDVar16 != (Data *)0x0) &&
     ((this->lastWidgetUnderMouse).wp.value != (QObject *)0x0 && *(int *)(pDVar16 + 4) != 0)) {
    widgetsCursor.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::cursor((QWidget *)&widgetsCursor);
    QGraphicsItem::cursor(&local_c8);
    cVar5 = ::operator==((QCursor *)&local_c8,&widgetsCursor);
    QCursor::~QCursor((QCursor *)&local_c8);
    if (cVar5 == '\0') {
      QGraphicsItem::setCursor(pQVar20 + 1,&widgetsCursor);
    }
    QCursor::~QCursor(&widgetsCursor);
  }
  (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,0xaa);
  QMouseEvent::~QMouseEvent(&mouseEvent);
LAB_005f850e:
  if (local_68.d != (Data *)0x0) {
    LOCK();
    *(int *)local_68.d = *(int *)local_68.d + -1;
    UNLOCK();
    if (*(int *)local_68.d == 0) {
      pDVar16 = local_68.d;
      if (local_68.d == (Data *)0x0) {
        pDVar16 = (Data *)0x0;
      }
      operator_delete(pDVar16);
    }
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    *(int *)local_58.d = *(int *)local_58.d + -1;
    UNLOCK();
    if (*(int *)local_58.d == 0) {
      pDVar16 = local_58.d;
      if (local_58.d == (Data *)0x0) {
        pDVar16 = (Data *)0x0;
      }
      operator_delete(pDVar16);
    }
  }
LAB_005f855a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(QGraphicsSceneMouseEvent *event)
{
    if (!event || !widget || !widget->isVisible())
        return;
    Q_Q(QGraphicsProxyWidget);

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : widget;

    if (QWidgetPrivate::nearestGraphicsProxyWidget(receiver) != q)
        return; //another proxywidget will handle the events

    // Translate QGraphicsSceneMouse events to QMouseEvents.
    QEvent::Type type = QEvent::None;
    switch (event->type()) {
    case QEvent::GraphicsSceneMousePress:
        type = QEvent::MouseButtonPress;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseRelease:
        type = QEvent::MouseButtonRelease;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseDoubleClick:
        type = QEvent::MouseButtonDblClick;
        if (!embeddedMouseGrabber)
            embeddedMouseGrabber = receiver;
        else
            receiver = embeddedMouseGrabber;
        break;
    case QEvent::GraphicsSceneMouseMove:
        type = QEvent::MouseMove;
        if (embeddedMouseGrabber)
            receiver = embeddedMouseGrabber;
        break;
    default:
        Q_ASSERT_X(false, "QGraphicsProxyWidget", "internal error");
        break;
    }

    if (!lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(embeddedMouseGrabber ? embeddedMouseGrabber : receiver, nullptr, event->screenPos());
        lastWidgetUnderMouse = receiver;
    }

    // Map event position from us to the receiver
    pos = mapToReceiver(pos, receiver);

    // Send mouse event.
    QMouseEvent mouseEvent(type, pos, receiver->mapTo(receiver->topLevelWidget(), pos.toPoint()),
                           receiver->mapToGlobal(pos.toPoint()),
                           event->button(), event->buttons(), event->modifiers(), event->source());
    mouseEvent.setTimestamp(event->timestamp());

    QWidget *embeddedMouseGrabberPtr = (QWidget *)embeddedMouseGrabber;
    QApplicationPrivate::sendMouseEvent(receiver, &mouseEvent, alienWidget, widget,
                                        &embeddedMouseGrabberPtr, lastWidgetUnderMouse, event->spontaneous());
    embeddedMouseGrabber = embeddedMouseGrabberPtr;

    // Handle enter/leave events when last button is released from mouse
    // grabber child widget.
    if (embeddedMouseGrabber && type == QEvent::MouseButtonRelease && !event->buttons()) {
        Q_Q(QGraphicsProxyWidget);
        if (q->rect().contains(event->pos()) && q->acceptHoverEvents())
            lastWidgetUnderMouse = alienWidget ? alienWidget : widget;
        else // released on the frame our outside the item, or doesn't accept hover events.
            lastWidgetUnderMouse = nullptr;

        QApplicationPrivate::dispatchEnterLeave(lastWidgetUnderMouse, embeddedMouseGrabber, event->screenPos());
        embeddedMouseGrabber = nullptr;

#ifndef QT_NO_CURSOR
        // ### Restore the cursor, don't override it.
        if (!lastWidgetUnderMouse)
            q->unsetCursor();
#endif
    }

#ifndef QT_NO_CURSOR
    // Keep cursor in sync
    if (lastWidgetUnderMouse) {
        QCursor widgetsCursor = lastWidgetUnderMouse->cursor();
        if (q->cursor() != widgetsCursor)
            q->setCursor(widgetsCursor);
    }
#endif

    event->setAccepted(mouseEvent.isAccepted());
}